

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O0

void __thiscall cmDebugServerJson::SendStatus(cmDebugServerJson *this,cmConnection *connection)

{
  long lVar1;
  undefined1 local_38 [8];
  string status;
  cmConnection *connection_local;
  cmDebugServerJson *this_local;
  
  status.field_2._8_8_ = connection;
  StatusString_abi_cxx11_((string *)local_38,this);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    (*(code *)**(undefined8 **)status.field_2._8_8_)(status.field_2._8_8_,local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmDebugServerJson::SendStatus(cmConnection* connection)
{
  auto status = StatusString();
  if (status.size()) {
    connection->WriteData(status);
  }
}